

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRStereoNode.cpp
# Opt level: O3

void __thiscall
MinVR::VRStereoNode::setCameraMatrix(VRStereoNode *this,VRDataIndex *renderState,VREyePosition eye)

{
  pointer pcVar1;
  bool bVar2;
  VRAnyCoreType t;
  VRError *this_00;
  VRMatrix4 cameraMatrix;
  VRMatrix4 headMatrix;
  int local_1d4;
  undefined1 local_1d0 [32];
  undefined1 local_1b0 [72];
  undefined1 local_168 [72];
  string local_120;
  string local_100;
  undefined1 local_e0 [72];
  string local_98;
  VRMatrix4 local_78;
  
  VRMatrix4::VRMatrix4(&local_78);
  pcVar1 = local_168 + 0x10;
  local_168._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"HeadMatrix","");
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"");
  bVar2 = VRDataIndex::exists(renderState,(string *)local_168,&local_100,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_168._0_8_ != pcVar1) {
    operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
  }
  if (!bVar2) {
    this_00 = (VRError *)__cxa_allocate_exception(0xa8);
    local_168._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_168,"VRStereoNode cannot find HeadMatrix in the current RenderState",
               "");
    local_1b0._0_8_ = local_1b0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,
               "The display graph should include a VRHeadTrackingNode or a VRLookAtNode or some other method of defining a HeadMatrix before reaching the VRStereoNode."
               ,"");
    local_e0._0_8_ = local_e0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_e0,
               "/workspace/llm4binary/github/license_c_cmakelists/MinVR[P]MinVR/src/display/VRStereoNode.cpp"
               ,"");
    local_1d4 = 0x70;
    local_1d0._0_8_ = local_1d0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1d0,
               "void MinVR::VRStereoNode::setCameraMatrix(VRDataIndex *, VREyePosition)","");
    VRError::VRError(this_00,(string *)local_168,(string *)local_1b0,(string *)local_e0,&local_1d4,
                     (string *)local_1d0);
    __cxa_throw(this_00,&VRError::typeinfo,VRError::~VRError);
  }
  pcVar1 = local_1b0 + 0x10;
  local_1b0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"HeadMatrix","");
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"");
  t = VRDataIndex::getValue(renderState,(string *)local_1b0,&local_120,true);
  VRMatrix4::VRMatrix4((VRMatrix4 *)local_168,t);
  VRMatrix4::operator=(&local_78,(VRMatrix4 *)local_168);
  VRMatrix4::~VRMatrix4((VRMatrix4 *)local_168);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_1b0._0_8_ != pcVar1) {
    operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
  }
  VRMatrix4::VRMatrix4((VRMatrix4 *)local_168,&local_78);
  if (eye == Right) {
    VRVector3::VRVector3((VRVector3 *)local_1d0,this->_iod * 0.5,0.0,0.0);
    VRMatrix4::translation((VRMatrix4 *)local_e0,(VRVector3 *)local_1d0);
    operator*((VRMatrix4 *)local_1b0,(VRMatrix4 *)local_168,(VRMatrix4 *)local_e0);
    VRMatrix4::operator=((VRMatrix4 *)local_168,(VRMatrix4 *)local_1b0);
  }
  else {
    if (eye != Left) goto LAB_0014c19e;
    VRVector3::VRVector3((VRVector3 *)local_1d0,this->_iod * -0.5,0.0,0.0);
    VRMatrix4::translation((VRMatrix4 *)local_e0,(VRVector3 *)local_1d0);
    operator*((VRMatrix4 *)local_1b0,(VRMatrix4 *)local_168,(VRMatrix4 *)local_e0);
    VRMatrix4::operator=((VRMatrix4 *)local_168,(VRMatrix4 *)local_1b0);
  }
  VRMatrix4::~VRMatrix4((VRMatrix4 *)local_1b0);
  VRMatrix4::~VRMatrix4((VRMatrix4 *)local_e0);
  VRVector3::~VRVector3((VRVector3 *)local_1d0);
LAB_0014c19e:
  local_1b0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"CameraMatrix","");
  VRDataIndex::addData
            (&local_98,renderState,(string *)local_1b0,(VRFloatArrayConvertible *)local_168);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_1b0._0_8_ != pcVar1) {
    operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
  }
  VRMatrix4::~VRMatrix4((VRMatrix4 *)local_168);
  VRMatrix4::~VRMatrix4(&local_78);
  return;
}

Assistant:

void VRStereoNode::setCameraMatrix(VRDataIndex *renderState, VREyePosition eye)
{

    // This should be set by a HeadTrackingNode or a LookAtNode before reaching
    // this StereoNode
	VRMatrix4 headMatrix;
	if (renderState->exists("HeadMatrix")) {
		headMatrix = renderState->getValue("HeadMatrix");

	} else {
    VRERROR("VRStereoNode cannot find HeadMatrix in the current RenderState",
            "The display graph should include a VRHeadTrackingNode or a "
            "VRLookAtNode or some other method of defining a HeadMatrix "
            "before reaching the VRStereoNode.");
  }

  VRMatrix4 cameraMatrix = headMatrix;
  if (eye == Left) {
    cameraMatrix = cameraMatrix * VRMatrix4::translation(VRVector3(-_iod / 2.0f, 0, 0));
	} else if (eye == Right) {
    cameraMatrix = cameraMatrix * VRMatrix4::translation(VRVector3(_iod / 2.0f, 0, 0));
	}

	renderState->addData("CameraMatrix", cameraMatrix);
}